

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeMipmapTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeMipmapTestInstance *this)

{
  TextureRenderer *this_00;
  deUint32 *this_01;
  CoordType CVar1;
  int y;
  int width;
  int height;
  TestLog *pTVar2;
  int i;
  deUint32 dVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  TextureFormat TVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Surface *pSVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  void *pvVar13;
  int local_4b8;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  undefined1 local_490 [40];
  undefined1 local_468 [40];
  long local_440;
  deUint32 local_438;
  deUint32 local_434;
  float local_430;
  float local_42c;
  undefined1 local_428 [48];
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrec;
  undefined1 local_3d0 [40];
  Surface referenceFrame;
  Surface renderedFrame;
  PixelFormat pixelFormat;
  Surface errorMask;
  LookupPrecision local_348;
  Random rnd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  int local_2f8;
  undefined1 auStack_2f4 [84];
  ios_base local_2a0 [276];
  ReferenceParams refParams;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [6];
  IVec4 formatBitDepth;
  PixelBufferAccess local_58;
  
  this_00 = &this->m_renderer;
  dVar3 = util::TextureRenderer::getRenderWidth(this_00);
  dVar4 = util::TextureRenderer::getRenderHeight(this_00);
  CVar1 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&refParams,TEXTURETYPE_CUBE);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tcu::Surface::Surface(&renderedFrame,dVar3,dVar4);
  util::createSampler((Sampler *)&rnd,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  refParams.sampler.magFilter = local_308._M_allocated_capacity._0_4_;
  refParams.sampler.lodThreshold = (float)local_308._M_allocated_capacity._4_4_;
  refParams.sampler.normalizedCoords = (bool)local_308._M_local_buf[8];
  refParams.sampler._25_3_ = local_308._9_3_;
  refParams.sampler.compare = local_308._12_4_;
  refParams.sampler.wrapS = rnd.m_rnd.x;
  refParams.sampler.wrapT = rnd.m_rnd.y;
  refParams.sampler.wrapR = rnd.m_rnd.z;
  refParams.sampler.minFilter = rnd.m_rnd.w;
  refParams.sampler.borderColor.v.uData[1] = auStack_2f4._4_4_;
  TVar7 = ::vk::mapVkFormat((this->m_testParameters).super_TextureCubeTestCaseParameters.
                            super_TextureCommonTestCaseParameters.format);
  refParams.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(TVar7);
  refParams.super_RenderParams.flags =
       (uint)(CVar1 == COORDTYPE_PROJECTED) + (uint)(CVar1 == COORDTYPE_BASIC_BIAS) * 2;
  refParams.lodMode = LODMODE_EXACT;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&rnd.m_rnd,7);
  randomPartition(&gridLayout,&rnd,0,0,dVar3,dVar4);
  local_438 = dVar4;
  local_434 = dVar3;
  if (texture::(anonymous_namespace)::TextureCubeMipmapTestInstance::iterate()::s_projections ==
      '\0') {
    _GLOBAL__N_1::TextureCubeMipmapTestInstance::iterate();
  }
  if (0 < (int)((ulong)((long)gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)gridLayout.
                             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
    lVar12 = 0xc;
    uVar11 = 0;
    do {
      local_440 = CONCAT44(local_440._4_4_,
                           (float)*(int *)((long)(gridLayout.
                                                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->m_data
                                          + lVar12 + -0xc));
      uVar10 = (uint)uVar11;
      iVar6 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -8);
      local_42c = (float)*(int *)((long)(gridLayout.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                 lVar12 + -4);
      local_430 = (float)*(int *)((long)(gridLayout.
                                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12
                                 );
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,uVar10 + (int)((uVar11 & 0xffffffff) / 6) * -6);
      if (CVar1 == COORDTYPE_PROJECTED) {
        refParams.super_RenderParams.flags = refParams.super_RenderParams.flags | 1;
        uVar8 = (ulong)((uVar10 & 3) << 4);
        refParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar8);
        refParams.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar8 + 8);
      }
      if (CVar1 == COORDTYPE_BASIC_BIAS) {
        refParams.super_RenderParams.flags = refParams.super_RenderParams.flags | 2;
        refParams.super_RenderParams.bias = Texture2DMipmapTestInstance::iterate::s_bias[uVar10 & 7]
        ;
      }
      util::TextureRenderer::setViewport(this_00,(float)local_440,(float)iVar6,local_42c,local_430);
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&refParams);
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x10;
    } while ((long)uVar11 <
             (long)(int)((ulong)((long)gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gridLayout.
                                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  rnd.m_rnd._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)&rnd);
  dVar4 = local_434;
  dVar3 = local_438;
  pixelFormat.redBits = formatBitDepth.m_data[0];
  pixelFormat.greenBits = formatBitDepth.m_data[1];
  pixelFormat.blueBits = formatBitDepth.m_data[2];
  pixelFormat.alphaBits = formatBitDepth.m_data[3];
  tcu::Surface::Surface(&referenceFrame,local_434,local_438);
  tcu::Surface::Surface(&errorMask,dVar4,dVar3);
  lVar12 = 0;
  do {
    local_348.coordBits.m_data[lVar12] = 0x16;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  lVar12 = 3;
  do {
    local_348.coordBits.m_data[lVar12] = 0x10;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 6);
  local_348.colorThreshold.m_data[0] = 0.0;
  local_348.colorThreshold.m_data[1] = 0.0;
  local_348.colorThreshold.m_data[2] = 0.0;
  local_348.colorThreshold.m_data[3] = 0.0;
  local_348.colorMask.m_data[0] = true;
  local_348.colorMask.m_data[1] = true;
  local_348.colorMask.m_data[2] = true;
  local_348.colorMask.m_data[3] = true;
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  util::createSampler((Sampler *)&rnd,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  refParams.sampler.compareChannel = local_2f8;
  refParams.sampler.magFilter = local_308._M_allocated_capacity._0_4_;
  refParams.sampler.lodThreshold = (float)local_308._M_allocated_capacity._4_4_;
  refParams.sampler.normalizedCoords = (bool)local_308._M_local_buf[8];
  refParams.sampler._25_3_ = local_308._9_3_;
  refParams.sampler.compare = local_308._12_4_;
  refParams.sampler.wrapS = rnd.m_rnd.x;
  refParams.sampler.wrapT = rnd.m_rnd.y;
  refParams.sampler.wrapR = rnd.m_rnd.z;
  refParams.sampler.minFilter = rnd.m_rnd.w;
  refParams.sampler._53_7_ = SUB87(CONCAT44(auStack_2f4._20_4_,auStack_2f4._16_4_) >> 8,0);
  refParams.sampler.seamlessCubeMap = true;
  refParams.lodMode = LODMODE_EXACT;
  local_348.colorMask.m_data[1] = 0 < pixelFormat.greenBits;
  local_348.colorMask.m_data[0] = 0 < pixelFormat.redBits;
  local_348.colorMask.m_data[2] = 0 < pixelFormat.blueBits;
  local_348.colorMask.m_data[3] = 0 < pixelFormat.alphaBits;
  local_490._0_4_ = pixelFormat.redBits;
  local_490._4_4_ = pixelFormat.greenBits;
  local_490._8_4_ = pixelFormat.blueBits;
  local_490._12_4_ = pixelFormat.alphaBits;
  local_468._0_4_ = R;
  local_468._4_4_ = SNORM_INT8;
  local_468._8_8_ = 0;
  lVar12 = 0;
  do {
    *(int *)(local_468 + lVar12 * 4) = *(int *)(local_490 + lVar12 * 4) + -2;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  local_428._0_4_ = R;
  local_428._4_4_ = SNORM_INT8;
  local_428._8_8_ = 0;
  res.m_data[0] = 0;
  res.m_data[1] = 0;
  res.m_data[2] = 0;
  res.m_data[3] = 0;
  lVar12 = 0;
  do {
    iVar6 = *(int *)(local_428 + lVar12 * 4);
    if (*(int *)(local_428 + lVar12 * 4) < *(int *)(local_468 + lVar12 * 4)) {
      iVar6 = *(int *)(local_468 + lVar12 * 4);
    }
    res.m_data[lVar12] = iVar6;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 4);
  tcu::computeFixedPointThreshold((tcu *)&rnd,&res);
  local_348.colorThreshold.m_data[0] = (float)rnd.m_rnd.x;
  local_348.colorThreshold.m_data[1] = (float)rnd.m_rnd.y;
  local_348.colorThreshold.m_data[2] = (float)rnd.m_rnd.z;
  local_348.colorThreshold.m_data[3] = (float)rnd.m_rnd.w;
  if (CVar1 == COORDTYPE_PROJECTED) {
    lVar12 = 0;
    do {
      (&rnd.m_rnd.x)[lVar12] = 8;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lodPrec.lodBits = 3;
  }
  else {
    lVar12 = 0;
    do {
      (&rnd.m_rnd.x)[lVar12] = 10;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 3);
    lodPrec.lodBits = 6;
  }
  local_348.coordBits.m_data[2] = rnd.m_rnd.z;
  local_348.coordBits.m_data[0] = rnd.m_rnd.x;
  local_348.coordBits.m_data[1] = rnd.m_rnd.y;
  local_348.uvwBits.m_data[0] = 5;
  local_348.uvwBits.m_data[1] = 5;
  local_348.uvwBits.m_data[2] = 0;
  lodPrec.derivateBits = 10;
  if ((int)((ulong)((long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)gridLayout.
                         super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) < 1) {
    local_4b8 = 0;
  }
  else {
    uVar11 = 0;
    lVar12 = 0xc;
    local_4b8 = 0;
    do {
      uVar10 = (uint)uVar11;
      iVar6 = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -0xc);
      y = *(int *)((long)(gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -8);
      width = *(int *)((long)(gridLayout.
                              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + -4);
      height = *(int *)((long)(gridLayout.
                               super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12);
      local_440 = lVar12;
      glu::TextureTestUtil::computeQuadTexCoordCube
                (&texCoord,uVar10 + (int)((uVar11 & 0xffffffff) / 6) * -6);
      if (CVar1 == COORDTYPE_PROJECTED) {
        refParams.super_RenderParams.flags = refParams.super_RenderParams.flags | 1;
        uVar8 = (ulong)((uVar10 & 3) << 4);
        refParams.super_RenderParams.w.m_data._0_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar8);
        refParams.super_RenderParams.w.m_data._8_8_ =
             *(undefined8 *)((long)iterate::s_projections[0].m_data + uVar8 + 8);
      }
      if (CVar1 == COORDTYPE_BASIC_BIAS) {
        refParams.super_RenderParams.flags = refParams.super_RenderParams.flags | 2;
        refParams.super_RenderParams.bias = Texture2DMipmapTestInstance::iterate::s_bias[uVar10 & 7]
        ;
      }
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)&res,&referenceFrame,&pixelFormat,iVar6,y,width,height);
      iVar5 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      lVar12 = CONCAT44(extraout_var,iVar5);
      auStack_2f4._12_4_ = (undefined4)*(undefined8 *)(lVar12 + 0x160);
      auStack_2f4._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar12 + 0x160) >> 0x20);
      rnd.m_rnd._0_8_ = *(undefined8 *)(lVar12 + 0x130);
      rnd.m_rnd._8_8_ = *(undefined8 *)(lVar12 + 0x138);
      local_308._M_allocated_capacity = *(undefined8 *)(lVar12 + 0x140);
      local_308._8_8_ = *(undefined8 *)(lVar12 + 0x148);
      local_2f8 = (int)*(undefined8 *)(lVar12 + 0x150);
      auStack_2f4._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar12 + 0x150) >> 0x20);
      auStack_2f4._4_4_ = (undefined4)*(undefined8 *)(lVar12 + 0x158);
      auStack_2f4._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar12 + 0x158) >> 0x20);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)&res,(TextureCubeView *)&rnd,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,&refParams);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar13 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar13 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_468,(TextureFormat *)&rnd,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)&res,(PixelBufferAccess *)local_468,iVar6,y,width,
                        height);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar13 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar13 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_428,(TextureFormat *)&rnd,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)local_490,(PixelBufferAccess *)local_428,iVar6,y,width,
                        height);
      rnd.m_rnd.x = 8;
      rnd.m_rnd.y = 3;
      pvVar13 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar13 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_58,(TextureFormat *)&rnd,errorMask.m_width,errorMask.m_height,1,pvVar13);
      tcu::getSubregion((PixelBufferAccess *)local_3d0,&local_58,iVar6,y,width,height);
      iVar6 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      lVar12 = CONCAT44(extraout_var_00,iVar6);
      auStack_2f4._12_4_ = (undefined4)*(undefined8 *)(lVar12 + 0x160);
      auStack_2f4._16_4_ = (undefined4)((ulong)*(undefined8 *)(lVar12 + 0x160) >> 0x20);
      rnd.m_rnd._0_8_ = *(undefined8 *)(lVar12 + 0x130);
      rnd.m_rnd._8_8_ = *(undefined8 *)(lVar12 + 0x138);
      local_308._M_allocated_capacity = *(long *)(lVar12 + 0x140);
      local_308._8_8_ = *(undefined8 *)(lVar12 + 0x148);
      local_2f8 = (int)*(undefined8 *)(lVar12 + 0x150);
      auStack_2f4._0_4_ = (undefined4)((ulong)*(undefined8 *)(lVar12 + 0x150) >> 0x20);
      auStack_2f4._4_4_ = (undefined4)*(undefined8 *)(lVar12 + 0x158);
      auStack_2f4._8_4_ = (undefined4)((ulong)*(undefined8 *)(lVar12 + 0x158) >> 0x20);
      iVar6 = glu::TextureTestUtil::computeTextureLookupDiff
                        ((ConstPixelBufferAccess *)&res,(ConstPixelBufferAccess *)local_490,
                         (PixelBufferAccess *)local_3d0,(TextureCubeView *)&rnd,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,&refParams,&local_348,&lodPrec,
                         ((this->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      local_4b8 = local_4b8 + iVar6;
      uVar11 = uVar11 + 1;
      lVar12 = local_440 + 0x10;
    } while ((long)uVar11 <
             (long)(int)((ulong)((long)gridLayout.
                                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)gridLayout.
                                      super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4));
  }
  if (0 < local_4b8) {
    rnd.m_rnd._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    this_01 = &rnd.m_rnd.z;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"ERROR: Image verification failed, found ",0x28);
    std::ostream::operator<<(this_01,local_4b8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," invalid pixels!",0x10);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
    std::ios_base::~ios_base(local_2a0);
  }
  pTVar2 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_468._0_8_ = (long)local_468 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Result","");
  local_490._0_8_ = (long)local_490 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"Verification result","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_468,(string *)local_490);
  tcu::TestLog::startImageSet(pTVar2,(char *)res.m_data._0_8_,local_d8._M_p);
  local_428._0_8_ = (long)local_428 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"Rendered","");
  TVar7 = (TextureFormat)((long)local_3d0 + 0x10);
  local_3d0._0_8_ = TVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Rendered image","");
  pSVar9 = &renderedFrame;
  tcu::LogImage::LogImage
            ((LogImage *)&rnd,(string *)local_428,(string *)local_3d0,pSVar9,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&rnd,(int)pTVar2,__buf,(size_t)pSVar9);
  if ((undefined1 *)CONCAT44(auStack_2f4._0_4_,local_2f8) != auStack_2f4 + 0xc) {
    operator_delete((undefined1 *)CONCAT44(auStack_2f4._0_4_,local_2f8),
                    CONCAT44(auStack_2f4._16_4_,auStack_2f4._12_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rnd.m_rnd._0_8_ != &local_308) {
    operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
  }
  if ((TextureFormat)local_3d0._0_8_ != TVar7) {
    operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
  }
  if (local_428._0_8_ != (long)local_428 + 0x10) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != local_c8) {
    operator_delete(local_d8._M_p,local_c8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != &local_e8) {
    operator_delete((void *)res.m_data._0_8_,local_e8._M_allocated_capacity + 1);
  }
  if (local_490._0_8_ != (long)local_490 + 0x10) {
    operator_delete((void *)local_490._0_8_,local_490._16_8_ + 1);
  }
  if (local_468._0_8_ != (long)local_468 + 0x10) {
    operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
  }
  if (0 < local_4b8) {
    pTVar2 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    local_468._0_8_ = (long)local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_468,"Reference","");
    local_490._0_8_ = (long)local_490 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_490,"Ideal reference","");
    pSVar9 = &referenceFrame;
    tcu::LogImage::LogImage
              ((LogImage *)&rnd,(string *)local_468,(string *)local_490,pSVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    iVar6 = (int)pTVar2;
    tcu::LogImage::write((LogImage *)&rnd,iVar6,__buf_00,(size_t)pSVar9);
    local_428._0_8_ = (long)local_428 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"ErrorMask","");
    local_3d0._0_8_ = TVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"Error mask","");
    pSVar9 = &errorMask;
    tcu::LogImage::LogImage
              ((LogImage *)&res,(string *)local_428,(string *)local_3d0,pSVar9,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&res,iVar6,__buf_01,(size_t)pSVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_p != local_c8) {
      operator_delete(local_d8._M_p,local_c8[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)res.m_data._0_8_ != &local_e8) {
      operator_delete((void *)res.m_data._0_8_,local_e8._M_allocated_capacity + 1);
    }
    if ((TextureFormat)local_3d0._0_8_ != TVar7) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if (local_428._0_8_ != (long)local_428 + 0x10) {
      operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
    }
    if ((undefined1 *)CONCAT44(auStack_2f4._0_4_,local_2f8) != auStack_2f4 + 0xc) {
      operator_delete((undefined1 *)CONCAT44(auStack_2f4._0_4_,local_2f8),
                      CONCAT44(auStack_2f4._16_4_,auStack_2f4._12_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rnd.m_rnd._0_8_ != &local_308) {
      operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
    }
    if (local_490._0_8_ != (long)local_490 + 0x10) {
      operator_delete((void *)local_490._0_8_,local_490._16_8_ + 1);
    }
    if (local_468._0_8_ != (long)local_468 + 0x10) {
      operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
    }
  }
  tcu::TestLog::endImageSet(((this->super_TestInstance).m_context)->m_testCtx->m_log);
  rnd.m_rnd._0_8_ = &local_308;
  if (local_4b8 == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"pass","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
               rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"fail","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
               rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rnd.m_rnd._0_8_ != &local_308) {
    operator_delete((void *)rnd.m_rnd._0_8_,(ulong)(local_308._M_allocated_capacity + 1));
  }
  tcu::Surface::~Surface(&errorMask);
  tcu::Surface::~Surface(&referenceFrame);
  if (gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(gridLayout.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)gridLayout.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&renderedFrame);
  if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureCubeMipmapTestInstance::iterate (void)
{
	const int			viewportWidth	= m_renderer.getRenderWidth();
	const int			viewportHeight	= m_renderer.getRenderHeight();

	const bool			isProjected		= m_testParameters.coordType == COORDTYPE_PROJECTED;
	const bool			useLodBias		= m_testParameters.coordType == COORDTYPE_BASIC_BIAS;

	ReferenceParams		refParams		(TEXTURETYPE_CUBE);
	vector<float>		texCoord;
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);

	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.samplerType	= getSamplerType(vk::mapVkFormat(m_testParameters.format));
	refParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	refParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewportWidth, viewportHeight);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	// Render with GL
	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const float			curX		= (float)gridLayout[cellNdx].x();
		const float			curY		= (float)gridLayout[cellNdx].y();
		const float			curW		= (float)gridLayout[cellNdx].z();
		const float			curH		= (float)gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

		DE_ASSERT(m_testParameters.coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			refParams.flags	|= ReferenceParams::PROJECTED;
			refParams.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			refParams.flags	|= ReferenceParams::USE_BIAS;
			refParams.bias	 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render
		m_renderer.setViewport(curX, curY, curW, curH);
		m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
	}

	// Render reference and compare
	{
		const tcu::IVec4		formatBitDepth		= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat			(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		tcu::Surface			referenceFrame		(viewportWidth, viewportHeight);
		tcu::Surface			errorMask			(viewportWidth, viewportHeight);
		int						numFailedPixels		= 0;
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_VULKAN);

		// Params for rendering reference
		refParams.sampler					= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
		refParams.sampler.seamlessCubeMap	= true;
		refParams.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat)-2, tcu::IVec4(0)));
		lookupPrec.coordBits		= isProjected ? tcu::IVec3(8) : tcu::IVec3(10);
		lookupPrec.uvwBits			= tcu::IVec3(5,5,0);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 3 : 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			DE_ASSERT(m_testParameters.coordType != COORDTYPE_AFFINE); // Not supported.
			computeQuadTexCoordCube(texCoord, cubeFace);

			if (isProjected)
			{
				refParams.flags	|= ReferenceParams::PROJECTED;
				refParams.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
			}

			if (useLodBias)
			{
				refParams.flags	|= ReferenceParams::USE_BIAS;
				refParams.bias	 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
			}

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, pixelFormat, curX, curY, curW, curH);
				sampleTexture(idealDst, m_texture->getTexture(), &texCoord[0], refParams);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getTexture(), &texCoord[0], refParams,
														lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
		}

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;
		}

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}